

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManDelay(Sbd_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  pGVar2 = p->pGia;
  lVar4 = (long)pGVar2->vCos->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar1 = pGVar2->vCos->pArray[lVar5];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar6 = iVar1 - (*(uint *)(pGVar2->pObjs + iVar1) & 0x1fffffff);
      if (((int)uVar6 < 0) || (p->vLutLevs->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vLutLevs->pArray[uVar6];
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return iVar3;
}

Assistant:

int Sbd_ManDelay( Sbd_Man_t * p )
{
    int i, Id, Delay = 0;
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vLutLevs, Id) );
    return Delay;
}